

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O1

void rnn_freedb(rnndb *db)

{
  rnnenum *__ptr;
  rnnbitset *__ptr_00;
  rnndomain *__ptr_01;
  rnnspectype *__ptr_02;
  rnngroup *__ptr_03;
  rnnauthor *__ptr_04;
  long lVar1;
  long lVar2;
  
  if (0 < db->enumsnum) {
    lVar2 = 0;
    do {
      __ptr = db->enums[lVar2];
      cleanupvarinfo(&__ptr->varinfo);
      if (0 < __ptr->valsnum) {
        lVar1 = 0;
        do {
          freevalue(__ptr->vals[lVar1]);
          lVar1 = lVar1 + 1;
        } while (lVar1 < __ptr->valsnum);
      }
      free(__ptr->vals);
      free(__ptr->fullname);
      free(__ptr->name);
      free(__ptr);
      lVar2 = lVar2 + 1;
    } while (lVar2 < db->enumsnum);
  }
  free(db->enums);
  if (0 < db->bitsetsnum) {
    lVar2 = 0;
    do {
      __ptr_00 = db->bitsets[lVar2];
      cleanupvarinfo(&__ptr_00->varinfo);
      if (0 < __ptr_00->bitfieldsnum) {
        lVar1 = 0;
        do {
          freebitfield(__ptr_00->bitfields[lVar1]);
          lVar1 = lVar1 + 1;
        } while (lVar1 < __ptr_00->bitfieldsnum);
      }
      free(__ptr_00->bitfields);
      free(__ptr_00->fullname);
      free(__ptr_00->name);
      free(__ptr_00);
      lVar2 = lVar2 + 1;
    } while (lVar2 < db->bitsetsnum);
  }
  free(db->bitsets);
  if (0 < db->domainsnum) {
    lVar2 = 0;
    do {
      __ptr_01 = db->domains[lVar2];
      cleanupvarinfo(&__ptr_01->varinfo);
      if (0 < __ptr_01->subelemsnum) {
        lVar1 = 0;
        do {
          freedelem(__ptr_01->subelems[lVar1]);
          lVar1 = lVar1 + 1;
        } while (lVar1 < __ptr_01->subelemsnum);
      }
      free(__ptr_01->subelems);
      free(__ptr_01->fullname);
      free(__ptr_01->name);
      free(__ptr_01);
      lVar2 = lVar2 + 1;
    } while (lVar2 < db->domainsnum);
  }
  free(db->domains);
  if (0 < db->spectypesnum) {
    lVar2 = 0;
    do {
      __ptr_02 = db->spectypes[lVar2];
      cleanuptypeinfo(&__ptr_02->typeinfo);
      free(__ptr_02->name);
      free(__ptr_02);
      lVar2 = lVar2 + 1;
    } while (lVar2 < db->spectypesnum);
  }
  free(db->spectypes);
  if (0 < db->groupsnum) {
    lVar2 = 0;
    do {
      __ptr_03 = db->groups[lVar2];
      free(__ptr_03->name);
      if (0 < __ptr_03->subelemsnum) {
        lVar1 = 0;
        do {
          freedelem(__ptr_03->subelems[lVar1]);
          lVar1 = lVar1 + 1;
        } while (lVar1 < __ptr_03->subelemsnum);
      }
      free(__ptr_03->subelems);
      free(__ptr_03);
      lVar2 = lVar2 + 1;
    } while (lVar2 < db->groupsnum);
  }
  free(db->groups);
  if (0 < (db->copyright).authorsnum) {
    lVar2 = 0;
    do {
      __ptr_04 = (db->copyright).authors[lVar2];
      if (0 < __ptr_04->nicknamesnum) {
        lVar1 = 0;
        do {
          free(__ptr_04->nicknames[lVar1]);
          lVar1 = lVar1 + 1;
        } while (lVar1 < __ptr_04->nicknamesnum);
      }
      free(__ptr_04->nicknames);
      free(__ptr_04->contributions);
      free(__ptr_04->email);
      free(__ptr_04->license);
      free(__ptr_04->name);
      free(__ptr_04);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (db->copyright).authorsnum);
  }
  free((db->copyright).authors);
  free((db->copyright).license);
  if (0 < db->filesnum) {
    lVar2 = 0;
    do {
      free(db->files[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < db->filesnum);
  }
  free(db->files);
  free(db);
  return;
}

Assistant:

void rnn_freedb (struct rnndb *db) {
	int i;

	for (i = 0; i < db->enumsnum; i++)
		freeenum(db->enums[i]);
	free(db->enums);

	for (i = 0; i < db->bitsetsnum; i++)
		freebitset(db->bitsets[i]);
	free(db->bitsets);

	for (i = 0; i < db->domainsnum; i++)
		freedomain(db->domains[i]);
	free(db->domains);

	for (i = 0; i < db->spectypesnum; i++)
		freespectype(db->spectypes[i]);
	free(db->spectypes);

	for (i = 0; i < db->groupsnum; i++)
		freegroup(db->groups[i]);
	free(db->groups);

	cleanupcopyright(&db->copyright);

	for (i = 0; i < db->filesnum; i++)
		free(db->files[i]);
	free(db->files);

	free(db);
}